

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall gl4cts::TextureFilterMinmaxUtils::Texture1D::Texture1D(Texture1D *this)

{
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Texture1D *local_10;
  Texture1D *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"float",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"sampler1D",&local_69);
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0xde0,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_0323b230;
  de::details::MovePtr<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>::MovePtr
            (&this->m_texture);
  return;
}

Assistant:

TextureFilterMinmaxUtils::Texture1D::Texture1D() : SupportedTextureType(GL_TEXTURE_1D, "float", "sampler1D")
{
}